

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O3

ze_result_t
loader::zetMetricCreateFromProgrammableExp
          (zet_metric_programmable_exp_handle_t hMetricProgrammable,
          zet_metric_programmable_param_value_exp_t *pParameterValues,uint32_t parameterCount,
          char *pName,char *pDescription,uint32_t *pMetricHandleCount,
          zet_metric_handle_t *phMetricHandles)

{
  zet_pfnMetricCreateFromProgrammableExp_t p_Var1;
  ze_result_t zVar2;
  object_t<_zet_metric_handle_t_*> *poVar3;
  ulong uVar4;
  dditable_t *dditable;
  dditable_t *local_38;
  
  local_38 = *(dditable_t **)(hMetricProgrammable + 8);
  p_Var1 = (local_38->zet).MetricExp.pfnCreateFromProgrammableExp;
  if (p_Var1 == (zet_pfnMetricCreateFromProgrammableExp_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar2 = (*p_Var1)(*(zet_metric_programmable_exp_handle_t *)hMetricProgrammable,pParameterValues,
                      parameterCount,pName,pDescription,pMetricHandleCount,phMetricHandles);
    if (((zVar2 == ZE_RESULT_SUCCESS) &&
        (zVar2 = ZE_RESULT_SUCCESS, phMetricHandles != (zet_metric_handle_t *)0x0)) &&
       (*pMetricHandleCount != 0)) {
      uVar4 = 0;
      do {
        poVar3 = singleton_factory_t<object_t<_zet_metric_handle_t*>,_zet_metric_handle_t*>::
                 getInstance<_zet_metric_handle_t*&,dditable_t*&>
                           ((singleton_factory_t<object_t<_zet_metric_handle_t*>,_zet_metric_handle_t*>
                             *)(context + 0x11a0),phMetricHandles,&local_38);
        *phMetricHandles = (zet_metric_handle_t)poVar3;
        uVar4 = uVar4 + 1;
        phMetricHandles = phMetricHandles + 1;
      } while (uVar4 < *pMetricHandleCount);
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricCreateFromProgrammableExp(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        zet_metric_programmable_param_value_exp_t* pParameterValues,///< [in] list of parameter values to be set.
        uint32_t parameterCount,                        ///< [in] Count of parameters to set.
        const char* pName,                              ///< [in] pointer to metric name to be used. Must point to a
                                                        ///< null-terminated character array no longer than ::ZET_MAX_METRIC_NAME.
        const char* pDescription,                       ///< [in] pointer to metric description to be used. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_DESCRIPTION.
        uint32_t* pMetricHandleCount,                   ///< [in,out] Pointer to the number of metric handles.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< number of metric handles available for this programmable.
                                                        ///< if count is greater than the number of metric handles available, then
                                                        ///< the driver shall update the value with the correct number of metric
                                                        ///< handles available.
        zet_metric_handle_t* phMetricHandles            ///< [in,out][optional][range(0,*pMetricHandleCount)] array of handle of metrics.
                                                        ///< if count is less than the number of metrics available, then driver
                                                        ///< shall only retrieve that number of metric handles.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_metric_programmable_exp_object_t*>( hMetricProgrammable )->dditable;
        auto pfnCreateFromProgrammableExp = dditable->zet.MetricExp.pfnCreateFromProgrammableExp;
        if( nullptr == pfnCreateFromProgrammableExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMetricProgrammable = reinterpret_cast<zet_metric_programmable_exp_object_t*>( hMetricProgrammable )->handle;

        // forward to device-driver
        result = pfnCreateFromProgrammableExp( hMetricProgrammable, pParameterValues, parameterCount, pName, pDescription, pMetricHandleCount, phMetricHandles );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handles to loader handles
            for( size_t i = 0; ( nullptr != phMetricHandles ) && ( i < *pMetricHandleCount ); ++i )
                phMetricHandles[ i ] = reinterpret_cast<zet_metric_handle_t>(
                    context->zet_metric_factory.getInstance( phMetricHandles[ i ], dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }